

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_allocator_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_0::PropagateOnAll_InsertDecomposes_Test::TestBody
          (PropagateOnAll_InsertDecomposes_Test *this)

{
  Table *this_00;
  anon_union_8_1_a8a14541_for_iterator_1 aVar1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar;
  AssertHelper local_60;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  undefined1 local_48 [8];
  anon_union_8_1_a8a14541_for_iterator_1 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  AssertHelper local_28;
  
  this_00 = &(this->super_PropagateOnAll).t1;
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
  ::insert<int,_0,_0,_nullptr>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>::iterator,_bool>
              *)local_48,this_00,(int *)0x0);
  aVar1 = local_40;
  local_60.data_._0_4_ = 1;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_PropagateOnAll).a1.state_.
        super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->num_allocs;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_48,"1","a1.num_allocs()",(int *)&local_60,(unsigned_long *)&local_58)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.slot_ == (slot_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(local_40.slot_)->val_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.slot_
                );
  }
  local_60.data_._0_4_ = 0;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       *((aVar1.slot_)->num_moves_).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_48,"0","it->num_moves()",(int *)&local_60,(unsigned_long *)&local_58)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.slot_ == (slot_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(local_40.slot_)->val_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.slot_
                );
  }
  local_60.data_._0_4_ = 0;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       *((aVar1.slot_)->num_copies_).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_48,"0","it->num_copies()",(int *)&local_60,(unsigned_long *)&local_58
            );
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.slot_ == (slot_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(local_40.slot_)->val_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.slot_
                );
  }
  raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>
  ::insert<int,_0,_0,_nullptr>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::Policy,_phmap::priv::(anonymous_namespace)::Identity,_std::equal_to<int>,_phmap::priv::(anonymous_namespace)::CheckedAlloc<phmap::priv::Tracked<int>,_7>_>::iterator,_bool>
              *)local_48,this_00,(int *)0x0);
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_58._M_head_impl._1_7_,local_38._M_local_buf[0]) ^ 1);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_38._M_local_buf[0] != false) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_58,(AssertionResult *)"t1.insert(0).second",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd1,(char *)CONCAT71(local_48._1_7_,local_48[0]));
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((undefined1 *)CONCAT71(local_48._1_7_,local_48[0]) != local_48 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_48._1_7_,local_48[0]),
                      CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1);
    }
    if ((long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,local_60.data_._0_4_) + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  local_60.data_._0_4_ = 1;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((this->super_PropagateOnAll).a1.state_.
        super___shared_ptr<phmap::priv::(anonymous_namespace)::AllocState,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->num_allocs;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_48,"1","a1.num_allocs()",(int *)&local_60,(unsigned_long *)&local_58)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.slot_ == (slot_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(local_40.slot_)->val_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.slot_
                );
  }
  local_60.data_._0_4_ = 0;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       *((aVar1.slot_)->num_moves_).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_48,"0","it->num_moves()",(int *)&local_60,(unsigned_long *)&local_58)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.slot_ == (slot_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(local_40.slot_)->val_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.slot_
                );
  }
  local_60.data_._0_4_ = 0;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       *((aVar1.slot_)->num_copies_).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_48,"0","it->num_copies()",(int *)&local_60,(unsigned_long *)&local_58
            );
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40.slot_ == (slot_type *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((_Alloc_hider *)&(local_40.slot_)->val_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_allocator_test.cc"
               ,0xd4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
  }
  if (local_40.slot_ != (slot_type *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_48 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.slot_
                );
  }
  return;
}

Assistant:

TEST_F(PropagateOnAll, InsertDecomposes) {
  auto it = t1.insert(0).first;
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(0, it->num_copies());

  EXPECT_FALSE(t1.insert(0).second);
  EXPECT_EQ(1, a1.num_allocs());
  EXPECT_EQ(0, it->num_moves());
  EXPECT_EQ(0, it->num_copies());
}